

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_debugInfo_attribute_secOffset
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uintptr_t value)

{
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,attribute);
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,0x17);
  sysbvm_dwarf_encodeDWord(&builder->info,(uint32_t)value);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_secOffset(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uintptr_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_sec_offset);

    sysbvm_dwarf_encodeDWord(&builder->info, (uint32_t)value);
}